

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

void __thiscall re2::Regexp::Walker<int>::Walker(Walker<int> *this)

{
  _Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_> *this_00;
  
  this->_vptr_Walker = (_func_int **)&PTR__Walker_001284d8;
  this_00 = (_Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_> *)
            operator_new(0x50);
  (this_00->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_00->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::_M_initialize_map
            (this_00,0);
  this->stack_ = (stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                  *)this_00;
  this->stopped_early_ = false;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new stack<WalkState<T> >;
  stopped_early_ = false;
}